

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O3

void write_section(char *section_name)

{
  FILE *__stream;
  int iVar1;
  char *__s1;
  section *psVar2;
  char **ppcVar3;
  
  psVar2 = section_list;
  if (section_list[0].name != (char *)0x0) {
    psVar2 = section_list + 1;
    __s1 = section_list[0].name;
    do {
      iVar1 = strcmp(__s1,section_name);
      if (iVar1 == 0) goto LAB_001109d9;
      __s1 = psVar2->name;
      psVar2 = psVar2 + 1;
    } while (__s1 != (char *)0x0);
  }
  write_section_cold_1();
LAB_001109d9:
  __stream = code_file;
  if (psVar2[-1].ptr[lflag != '\0'] != (char *)0x0) {
    ppcVar3 = psVar2[-1].ptr + (lflag != '\0');
    do {
      ppcVar3 = ppcVar3 + 1;
      outline = outline + 1;
      fprintf((FILE *)__stream,"%s\n");
    } while (*ppcVar3 != (char *)0x0);
  }
  return;
}

Assistant:

void write_section(char *section_name)
{
    char **section;
    FILE *fp;
    int i;
    struct section *sl;

    for(sl=&section_list[0]; sl->name; sl++) {
      if(strcmp(sl->name,section_name)==0) {
	break;
      }
    }
    if(sl->name==0) {
      fprintf(stderr, "Cannot find section '%s' in your skeleton file\n", section_name);
      exit(1);
    }

    section =  sl->ptr;
    fp = code_file;
    for (i = lflag ? 1 : 0; section[i]; ++i)
    {
	++outline;
	fprintf(fp, "%s\n", section[i]);
    }
}